

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int g_read(lua_State *L,FILE *f,int first)

{
  char cVar1;
  StkId pTVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  TValue *pTVar6;
  size_t n;
  char *pcVar7;
  StkId pTVar8;
  int iVar9;
  bool bVar10;
  Value local_38;
  
  pTVar8 = L->top;
  pTVar2 = L->base;
  clearerr((FILE *)f);
  iVar5 = (int)((ulong)((long)pTVar8 - (long)pTVar2) >> 4);
  if (iVar5 == 1) {
    uVar3 = read_line(L,f);
    iVar9 = first + 1;
  }
  else {
    luaL_checkstack(L,iVar5 + 0x13,"too many arguments");
    iVar5 = iVar5 + -2;
    iVar9 = first;
    do {
      pTVar6 = index2adr(L,iVar9);
      if ((pTVar6 == &luaO_nilobject_) || (pTVar6->tt != 3)) {
        pcVar7 = lua_tolstring(L,iVar9,(size_t *)0x0);
        if ((pcVar7 == (char *)0x0) || (*pcVar7 != '*')) {
          pcVar7 = "invalid option";
LAB_00111d57:
          luaL_argerror(L,iVar9,pcVar7);
        }
        cVar1 = pcVar7[1];
        if (cVar1 == 'a') {
          read_chars(L,f,0xffffffffffffffff);
          uVar3 = 1;
        }
        else if (cVar1 == 'l') {
          uVar3 = read_line(L,f);
        }
        else {
          if (cVar1 != 'n') {
            pcVar7 = "invalid format";
            goto LAB_00111d57;
          }
          iVar4 = __isoc99_fscanf(f,"%lf",&local_38);
          if (iVar4 != 1) {
            pTVar8 = L->top;
            pTVar8->tt = 0;
          }
          else {
            pTVar8 = L->top;
            pTVar8->value = local_38;
            pTVar8->tt = 3;
            pTVar8 = L->top;
          }
          uVar3 = (uint)(iVar4 == 1);
          L->top = pTVar8 + 1;
        }
      }
      else {
        n = lua_tointeger(L,iVar9);
        if (n == 0) {
          iVar4 = getc((FILE *)f);
          ungetc(iVar4,(FILE *)f);
          lua_pushlstring(L,(char *)0x0,0);
          uVar3 = (uint)(iVar4 != -1);
        }
        else {
          uVar3 = read_chars(L,f,n);
        }
      }
      iVar9 = iVar9 + 1;
      bVar10 = iVar5 != 0;
      iVar5 = iVar5 + -1;
    } while ((bVar10) && (uVar3 != 0));
  }
  iVar5 = ferror((FILE *)f);
  if (iVar5 == 0) {
    if (uVar3 == 0) {
      pTVar8 = L->top;
      pTVar8[-1].tt = 0;
      L->top = pTVar8;
    }
    iVar9 = iVar9 - first;
  }
  else {
    iVar9 = pushresult(L,0,(char *)0x0);
  }
  return iVar9;
}

Assistant:

static int g_read(lua_State*L,FILE*f,int first){
int nargs=lua_gettop(L)-1;
int success;
int n;
clearerr(f);
if(nargs==0){
success=read_line(L,f);
n=first+1;
}
else{
luaL_checkstack(L,nargs+20,"too many arguments");
success=1;
for(n=first;nargs--&&success;n++){
if(lua_type(L,n)==3){
size_t l=(size_t)lua_tointeger(L,n);
success=(l==0)?test_eof(L,f):read_chars(L,f,l);
}
else{
const char*p=lua_tostring(L,n);
luaL_argcheck(L,p&&p[0]=='*',n,"invalid option");
switch(p[1]){
case'n':
success=read_number(L,f);
break;
case'l':
success=read_line(L,f);
break;
case'a':
read_chars(L,f,~((size_t)0));
success=1;
break;
default:
return luaL_argerror(L,n,"invalid format");
}
}
}
}
if(ferror(f))
return pushresult(L,0,NULL);
if(!success){
lua_pop(L,1);
lua_pushnil(L);
}
return n-first;
}